

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O0

ssize_t __thiscall DomAction::read(DomAction *this,int __fd,void *__buf,size_t __nbytes)

{
  QStringView other;
  QStringView other_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  const_iterator o;
  size_t sVar4;
  void *__buf_00;
  void *__buf_01;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  DomProperty *v_1;
  DomProperty *v;
  QXmlStreamAttribute *attribute;
  QXmlStreamAttributes *__range1;
  QXmlStreamAttributes *attributes;
  QStringView tag;
  QStringView name;
  const_iterator __end1;
  const_iterator __begin1;
  parameter_type in_stack_fffffffffffffdb8;
  DomProperty *in_stack_fffffffffffffdc0;
  undefined7 in_stack_fffffffffffffdc8;
  byte in_stack_fffffffffffffdcf;
  DomProperty *in_stack_fffffffffffffdd0;
  uint in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffddc;
  parameter_type in_stack_fffffffffffffde0;
  undefined6 in_stack_fffffffffffffde8;
  byte in_stack_fffffffffffffdee;
  byte in_stack_fffffffffffffdef;
  const_iterator local_28 [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QXmlStreamReader::attributes();
  local_28[0].i = (QXmlStreamAttribute *)0xaaaaaaaaaaaaaaaa;
  local_28[0] = QList<QXmlStreamAttribute>::begin
                          ((QList<QXmlStreamAttribute> *)in_stack_fffffffffffffdc0);
  o = QList<QXmlStreamAttribute>::end((QList<QXmlStreamAttribute> *)in_stack_fffffffffffffdc0);
  while (bVar1 = QList<QXmlStreamAttribute>::const_iterator::operator!=(local_28,o), bVar1) {
    QList<QXmlStreamAttribute>::const_iterator::operator*(local_28);
    QXmlStreamAttribute::name((QXmlStreamAttribute *)0x1a5540);
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
               (size_t)in_stack_fffffffffffffdd0);
    QStringView::QStringView<QString,_true>
              ((QStringView *)in_stack_fffffffffffffdd0,
               (QString *)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8));
    in_stack_fffffffffffffdef =
         ::operator==((QStringView *)in_stack_fffffffffffffdc0,
                      (QStringView *)in_stack_fffffffffffffdb8);
    QString::~QString((QString *)0x1a55a4);
    if ((in_stack_fffffffffffffdef & 1) == 0) {
      Qt::Literals::StringLiterals::operator____s
                ((char16_t *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                 (size_t)in_stack_fffffffffffffdd0);
      QStringView::QStringView<QString,_true>
                ((QStringView *)in_stack_fffffffffffffdd0,
                 (QString *)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8));
      in_stack_fffffffffffffdee =
           ::operator==((QStringView *)in_stack_fffffffffffffdc0,
                        (QStringView *)in_stack_fffffffffffffdb8);
      QString::~QString((QString *)0x1a5655);
      if ((in_stack_fffffffffffffdee & 1) == 0) {
        in_stack_fffffffffffffde0 = (parameter_type)CONCAT44(in_register_00000034,__fd);
        Qt::Literals::StringLiterals::operator____L1
                  ((char *)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8),
                   (size_t)in_stack_fffffffffffffdc0);
        ::operator+((QLatin1String *)in_stack_fffffffffffffdc0,
                    (QStringView *)in_stack_fffffffffffffdb8);
        ::QStringBuilder::operator_cast_to_QString
                  ((QStringBuilder<QLatin1String,_const_QStringView_&> *)in_stack_fffffffffffffdb8);
        QXmlStreamReader::raiseError(&in_stack_fffffffffffffde0->m_attr_name);
        QString::~QString((QString *)0x1a572b);
      }
      else {
        QXmlStreamAttribute::value((QXmlStreamAttribute *)0x1a5669);
        QStringView::toString((QStringView *)in_stack_fffffffffffffdc0);
        setAttributeMenu((DomAction *)in_stack_fffffffffffffdc0,
                         &in_stack_fffffffffffffdb8->m_attr_name);
        QString::~QString((QString *)0x1a56ad);
      }
    }
    else {
      QXmlStreamAttribute::value((QXmlStreamAttribute *)0x1a55b8);
      QStringView::toString((QStringView *)in_stack_fffffffffffffdc0);
      setAttributeName((DomAction *)in_stack_fffffffffffffdc0,
                       &in_stack_fffffffffffffdb8->m_attr_name);
      QString::~QString((QString *)0x1a55fc);
    }
    QList<QXmlStreamAttribute>::const_iterator::operator++(local_28);
  }
  do {
    while( true ) {
      bVar1 = QXmlStreamReader::hasError((QXmlStreamReader *)0x1a5749);
      if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_001a59dc;
      iVar2 = QXmlStreamReader::readNext();
      if (iVar2 != 4) break;
      QXmlStreamReader::name();
      Qt::Literals::StringLiterals::operator____s
                ((char16_t *)CONCAT44(iVar2,in_stack_fffffffffffffdd8),
                 (size_t)in_stack_fffffffffffffdd0);
      QStringView::QStringView<QString,_true>
                ((QStringView *)in_stack_fffffffffffffdd0,
                 (QString *)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8));
      sVar4 = 0;
      other.m_data._0_6_ = in_stack_fffffffffffffde8;
      other.m_size = (qsizetype)in_stack_fffffffffffffde0;
      other.m_data._6_1_ = in_stack_fffffffffffffdee;
      other.m_data._7_1_ = in_stack_fffffffffffffdef;
      iVar3 = QStringView::compare((QStringView *)in_stack_fffffffffffffdb8,other,CaseInsensitive);
      in_stack_fffffffffffffdd8 = CONCAT13(iVar3 != 0,(int3)in_stack_fffffffffffffdd8) ^ 0xff000000;
      QString::~QString((QString *)0x1a581b);
      if ((in_stack_fffffffffffffdd8 & 0x1000000) == 0) {
        Qt::Literals::StringLiterals::operator____s
                  ((char16_t *)CONCAT44(iVar2,in_stack_fffffffffffffdd8),
                   (size_t)in_stack_fffffffffffffdd0);
        QStringView::QStringView<QString,_true>
                  ((QStringView *)in_stack_fffffffffffffdd0,
                   (QString *)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8));
        sVar4 = 0;
        other_00.m_data._0_6_ = in_stack_fffffffffffffde8;
        other_00.m_size = (qsizetype)in_stack_fffffffffffffde0;
        other_00.m_data._6_1_ = in_stack_fffffffffffffdee;
        other_00.m_data._7_1_ = in_stack_fffffffffffffdef;
        iVar2 = QStringView::compare
                          ((QStringView *)in_stack_fffffffffffffdb8,other_00,CaseInsensitive);
        in_stack_fffffffffffffdcf = iVar2 != 0 ^ 0xff;
        QString::~QString((QString *)0x1a58e4);
        if ((in_stack_fffffffffffffdcf & 1) == 0) {
          in_stack_fffffffffffffdb8 = (parameter_type)CONCAT44(in_register_00000034,__fd);
          Qt::Literals::StringLiterals::operator____L1
                    ((char *)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8),
                     (size_t)in_stack_fffffffffffffdc0);
          ::operator+((QLatin1String *)in_stack_fffffffffffffdc0,
                      (QStringView *)in_stack_fffffffffffffdb8);
          ::QStringBuilder::operator_cast_to_QString
                    ((QStringBuilder<QLatin1String,_const_QStringView_&> *)in_stack_fffffffffffffdb8
                    );
          QXmlStreamReader::raiseError(&in_stack_fffffffffffffdb8->m_attr_name);
          QString::~QString((QString *)0x1a59c1);
        }
        else {
          in_stack_fffffffffffffdc0 = (DomProperty *)operator_new(0x178);
          memset(in_stack_fffffffffffffdc0,0,0x178);
          DomProperty::DomProperty(in_stack_fffffffffffffdc0);
          DomProperty::read(in_stack_fffffffffffffdc0,__fd,__buf_01,sVar4);
          QList<DomProperty_*>::append((QList<DomProperty_*> *)0x1a5942,in_stack_fffffffffffffdb8);
        }
      }
      else {
        in_stack_fffffffffffffdd0 = (DomProperty *)operator_new(0x178);
        memset(in_stack_fffffffffffffdd0,0,0x178);
        DomProperty::DomProperty(in_stack_fffffffffffffdc0);
        DomProperty::read(in_stack_fffffffffffffdd0,__fd,__buf_00,sVar4);
        QList<DomProperty_*>::append((QList<DomProperty_*> *)0x1a5879,in_stack_fffffffffffffdb8);
      }
    }
  } while (iVar2 != 5);
LAB_001a59dc:
  QXmlStreamAttributes::~QXmlStreamAttributes((QXmlStreamAttributes *)0x1a59e9);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomAction::read(QXmlStreamReader &reader)
{
    const QXmlStreamAttributes &attributes = reader.attributes();
    for (const QXmlStreamAttribute &attribute : attributes) {
        const auto name = attribute.name();
        if (name == u"name"_s) {
            setAttributeName(attribute.value().toString());
            continue;
        }
        if (name == u"menu"_s) {
            setAttributeMenu(attribute.value().toString());
            continue;
        }
        reader.raiseError("Unexpected attribute "_L1 + name);
    }

    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            if (!tag.compare(u"property"_s, Qt::CaseInsensitive)) {
                auto *v = new DomProperty();
                v->read(reader);
                m_property.append(v);
                continue;
            }
            if (!tag.compare(u"attribute"_s, Qt::CaseInsensitive)) {
                auto *v = new DomProperty();
                v->read(reader);
                m_attribute.append(v);
                continue;
            }
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}